

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

void rtcSetSceneProgressMonitorFunction
               (RTCScene hscene,RTCProgressMonitorFunction progress,void *ptr)

{
  undefined8 *puVar1;
  DeviceEnterLeave enterleave;
  Lock<embree::MutexSys> lock;
  
  if (hscene != (RTCScene)0x0) {
    embree::DeviceEnterLeave::DeviceEnterLeave(&enterleave,hscene);
    lock.mutex = &g_mutex;
    lock.locked = true;
    embree::MutexSys::lock(&g_mutex);
    embree::Scene::setProgressMonitorFunction((Scene *)hscene,progress,ptr);
    embree::Lock<embree::MutexSys>::~Lock(&lock);
    embree::DeviceEnterLeave::~DeviceEnterLeave(&enterleave);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&lock,"invalid argument",(allocator *)&enterleave);
  *puVar1 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar1 + 1) = 2;
  std::__cxx11::string::string((string *)(puVar1 + 2),(string *)&lock);
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcSetSceneProgressMonitorFunction(RTCScene hscene, RTCProgressMonitorFunction progress, void* ptr) 
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcSetSceneProgressMonitorFunction);
    RTC_VERIFY_HANDLE(hscene);
    RTC_ENTER_DEVICE(hscene);
    Lock<MutexSys> lock(g_mutex);
    scene->setProgressMonitorFunction(progress,ptr);
    RTC_CATCH_END2(scene);
  }